

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::AddEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  int number;
  uint32_t uVar2;
  ulong uVar3;
  int *piVar4;
  int tmp;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (((byte)field[1] & 8) == 0) {
    uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar3 = (ulong)uVar2;
    this_00 = (RepeatedField<int> *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
    uVar1 = *(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
    if (uVar1 == *(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3 + 4)) {
      RepeatedField<int>::Reserve(this_00,uVar1 + 1);
      piVar4 = RepeatedField<int>::elements(this_00);
      piVar4[uVar1] = value;
    }
    else {
      piVar4 = RepeatedField<int>::elements(this_00);
      piVar4[uVar1] = value;
    }
    this_00->current_size_ = uVar1 + 1;
  }
  else {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 4);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_30 = FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),&local_30,&local_38);
    }
    internal::ExtensionSet::AddEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),number,
               (FieldType)field[2],*(bool *)(*(long *)(field + 0x38) + 0x4c),value,field);
  }
  return;
}

Assistant:

void Reflection::AddEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(), value,
                                          field);
  } else {
    AddField<int>(message, field, value);
  }
}